

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::EnqueueProcessedObject
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,FreeObject **list,
          void *objectAddress,uint index)

{
  HeapBlockType HVar1;
  undefined4 *puVar2;
  code *pcVar3;
  byte *pbVar4;
  uint uVar5;
  byte bVar6;
  bool bVar7;
  ushort uVar8;
  byte *pbVar9;
  uint i;
  int __c;
  undefined8 *in_FS_OFFSET;
  uchar retval;
  
  uVar8 = GetAddressIndex(this,objectAddress);
  if (uVar8 != index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x658,"(GetAddressIndex(objectAddress) == index)",
                       "GetAddressIndex(objectAddress) == index");
    if (!bVar7) goto LAB_00203a3b;
    *puVar2 = 0;
  }
  if (index == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x65a,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                       "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
    if (!bVar7) goto LAB_00203a3b;
    *puVar2 = 0;
  }
  if (this->objectCount == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x65b,"(this->objectCount != 1)","this->objectCount != 1");
    if (!bVar7) goto LAB_00203a3b;
    *puVar2 = 0;
  }
  if (&this->freeObjectList == list) {
    if (((ulong)objectAddress & 0xf) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                         ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                         "HeapInfo::IsAlignedAddress(objectAddress)");
      if (!bVar7) goto LAB_00203a3b;
      *puVar2 = 0;
    }
    uVar5 = (uint)((ulong)objectAddress >> 4);
    i = uVar5 & 0xff;
    BVStatic<256UL>::AssertRange(&this->debugFreeBits,i);
    pbVar4 = (byte *)((long)&(this->debugFreeBits).data[0].word + ((long)(int)i >> 3));
    uVar5 = uVar5 & 7;
    bVar6 = *pbVar4;
    *pbVar4 = *pbVar4 | '\x01' << uVar5;
    if ((bVar6 >> uVar5 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x661,"(!isSet)","!isSet");
      if (!bVar7) {
LAB_00203a3b:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
  }
  if (this->heapBucket->heapInfo->recycler->verifyEnabled == false) {
    HVar1 = (this->super_HeapBlock).heapBlockType;
    if ((HVar1 == SmallLeafBlockType) || (HVar1 == MediumLeafBlockType)) goto LAB_002039d4;
    __c = 0;
  }
  else {
    __c = 0xca;
  }
  memset(objectAddress,__c,(ulong)this->objectSize);
LAB_002039d4:
  FreeObject::SetNext((FreeObject *)objectAddress,*list);
  *list = (FreeObject *)objectAddress;
  if ((Js::Configuration::Global[0x2c156] == '\x01') &&
     (Js::Configuration::Global[0x2057e] == '\x01')) {
    (*(this->super_HeapBlock)._vptr_HeapBlock[4])(this,objectAddress);
  }
  pbVar9 = ObjectInfo(this,index);
  *pbVar9 = '\0';
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::EnqueueProcessedObject(FreeObject ** list, void* objectAddress, uint index)
{
    Assert(GetAddressIndex(objectAddress) == index);

    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);
    Assert(this->objectCount != 1);

#if DBG || defined(RECYCLER_STATS)
    if (list == &this->freeObjectList)
    {
        BOOL isSet = this->GetDebugFreeBitVector()->TestAndSet(GetAddressBitIndex(objectAddress));
        Assert(!isSet);
    }
#endif
    FillFreeMemory(objectAddress, objectSize);

    FreeObject * freeObject = (FreeObject *)objectAddress;
    freeObject->SetNext(*list);
    *list = freeObject;

#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(RecyclerVerifyMark))
    {
        this->WBClearObject((char*)objectAddress);
    }
#endif

    // clear the attributes so that when we are allocating a leaf, we don't have to set the attribute
    this->ObjectInfo(index) = 0;
}